

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BacktrackingTokenStream.h
# Opt level: O0

bool __thiscall
SGParser::BacktrackingTokenStream<SGParser::GenericToken>::SeekTo
          (BacktrackingTokenStream<SGParser::GenericToken> *this,size_t index)

{
  bool bVar1;
  size_t index_local;
  BacktrackingTokenStream<SGParser::GenericToken> *this_local;
  
  if (((index < this->pThisBlock->Index) ||
      (index < this->pThisBlock->Index + this->pThisBlock->Count)) ||
     (this->pThisBlock->Count == 0x200)) {
    if ((index < this->pFirstBlock->Index) || (this->Pos < index)) {
      return false;
    }
    this->pThisBlock = this->pFirstBlock;
    while( true ) {
      bVar1 = false;
      if (this->pThisBlock->Index + this->pThisBlock->Count <= index) {
        bVar1 = this->pThisBlock->pNext != (StreamBlock *)0x0;
      }
      if (!bVar1) break;
      this->pThisBlock = this->pThisBlock->pNext;
    }
  }
  this->ThisPos = index - this->pThisBlock->Index;
  return true;
}

Assistant:

bool BacktrackingTokenStream<Token>::SeekTo(size_t index) noexcept {
    // if this is not in our current block
    if (!(pThisBlock->Index <= index &&
          pThisBlock->Index + pThisBlock->Count <= index &&
          pThisBlock->Count != StreamBlock::BufferSize)) {
        // Otherwise seek from beginning
        // Check bounds
        if (index < pFirstBlock->Index || index > Pos)
            return false;
        // And seek till block that contains our index
        pThisBlock = pFirstBlock;
        while (index >= pThisBlock->Index + pThisBlock->Count && pThisBlock->pNext)
            pThisBlock = pThisBlock->pNext;
    }

    // Update index
    ThisPos = index - pThisBlock->Index;
    return true;
}